

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AudioPluginUtil.cpp
# Opt level: O3

void FFTProcess<double>(UnityComplexNumber *data,int numsamples,bool forward)

{
  bool bVar1;
  uint *puVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  uint uVar6;
  UnityComplexNumber *pUVar7;
  uint uVar8;
  UnityComplexNumber *pUVar9;
  uint uVar10;
  uint uVar11;
  double __x;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  UnityComplexNumber UVar18;
  double dVar19;
  double dVar20;
  UnityComplexNumber UVar21;
  
  uVar5 = (ulong)(uint)numsamples;
  uVar4 = 0;
  if (1 < (uint)numsamples) {
    uVar6 = 1;
    do {
      uVar6 = uVar6 * 2;
      uVar11 = (int)uVar4 + 1;
      uVar4 = (ulong)uVar11;
    } while (uVar6 < (uint)numsamples);
    uVar4 = (ulong)uVar11;
  }
  puVar2 = FFTProcess<double>::reversetable[uVar4];
  if (puVar2 == (uint *)0x0) {
    uVar3 = 0xffffffffffffffff;
    if (-1 < numsamples) {
      uVar3 = uVar5 * 4;
    }
    puVar2 = (uint *)operator_new__(uVar3);
    if (numsamples != 0) {
      uVar3 = 0;
      do {
        uVar6 = 0;
        if (numsamples != 1) {
          uVar11 = 1;
          uVar6 = 0;
          uVar8 = numsamples >> 1;
          do {
            uVar10 = uVar8 & (uint)uVar3;
            if (uVar10 != 0) {
              uVar10 = uVar11;
            }
            uVar6 = uVar6 | uVar10;
            uVar11 = uVar11 * 2;
            bVar1 = 1 < uVar8;
            uVar8 = uVar8 >> 1;
          } while (bVar1);
        }
        puVar2[uVar3] = uVar6;
        uVar3 = uVar3 + 1;
      } while (uVar3 != uVar5);
    }
    FFTProcess<double>::reversetable[uVar4] = puVar2;
  }
  if (numsamples != 0) {
    uVar4 = 0;
    do {
      uVar3 = (ulong)puVar2[uVar4];
      if (uVar4 < uVar3) {
        UVar18 = data[uVar4];
        data[uVar4] = data[uVar3];
        data[uVar3] = UVar18;
      }
      uVar4 = uVar4 + 1;
    } while (uVar5 != uVar4);
    if (1 < numsamples) {
      if (forward) {
        __x = -3.141592653589793;
      }
      else {
        __x = 3.141592653589793;
      }
      uVar6 = 1;
      do {
        dVar12 = cos(__x);
        dVar13 = sin(__x);
        uVar11 = uVar6 * 2;
        if (0 < (int)uVar6) {
          uVar5 = (ulong)uVar6;
          uVar4 = 0;
          dVar14 = 1.0;
          dVar15 = 0.0;
          pUVar7 = data;
          do {
            if ((int)uVar4 < numsamples) {
              uVar3 = uVar4 & 0xffffffff;
              pUVar9 = pUVar7;
              do {
                dVar16 = (double)pUVar9[uVar5].re;
                dVar19 = (double)pUVar9[uVar5].im;
                dVar17 = dVar16 * dVar14 + -dVar15 * dVar19;
                dVar16 = dVar19 * dVar14 + dVar15 * dVar16;
                dVar19 = (double)(*pUVar9).re;
                dVar20 = (double)(*pUVar9).im;
                UVar21.re = (float)(dVar19 - dVar17);
                UVar21.im = (float)(dVar20 - dVar16);
                pUVar9[uVar5] = UVar21;
                UVar18.re = (float)(dVar17 + dVar19);
                UVar18.im = (float)(dVar16 + dVar20);
                *pUVar9 = UVar18;
                pUVar9 = pUVar9 + uVar11;
                uVar6 = (int)uVar3 + uVar11;
                uVar3 = (ulong)uVar6;
              } while ((int)uVar6 < numsamples);
            }
            dVar16 = dVar14 * dVar13;
            dVar14 = -dVar15 * dVar13 + dVar14 * dVar12;
            dVar15 = dVar15 * dVar12 + dVar16;
            uVar4 = uVar4 + 1;
            pUVar7 = pUVar7 + 1;
          } while (uVar4 != uVar5);
        }
        __x = __x * 0.5;
        uVar6 = uVar11;
      } while ((int)uVar11 < numsamples);
    }
  }
  return;
}

Assistant:

static void FFTProcess(UnityComplexNumber* data, int numsamples, bool forward)
{
    unsigned int count = 1, numbits = 0;
    while (count < numsamples)
    {
        count += count;
        ++numbits;
    }

    static unsigned int* reversetable[32] = { NULL };
    unsigned int* tbl = reversetable[numbits];
    if (tbl == NULL)
    {
        tbl = new unsigned int[numsamples];
        for (unsigned int n = 0; n < numsamples; n++)
        {
            unsigned int j = 1, k = 0, m = numsamples >> 1;
            while (m > 0)
            {
                if (n & m)
                    k |= j;
                j += j;
                m >>= 1;
            }
            tbl[n] = k;
        }
#if ENABLE_TESTS
        for (unsigned int n = 0; n < numsamples; n++)
        {
            assert(tbl[tbl[n]] == n);
        }
#endif
        reversetable[numbits] = tbl;
    }

    for (unsigned int i = 0; i < numsamples; i++)
    {
        unsigned int j = tbl[i];
        if (i < j)
        {
            UnitySwap(data[i].re, data[j].re);
            UnitySwap(data[i].im, data[j].im);
        }
    }

    T w0 = (forward) ? -T(kPI_double) : T(kPI_double);
    for (int j = 1; j < numsamples; j += j)
    {
        UnityComplexNumberT<T> wr, wd;
        wr.Set(T(cos(w0)), T(sin(w0)));
        wd.Set(T(1.0), T(0.0));
        int step = j + j;
        for (int m = 0; m < j; ++m)
        {
            for (int i = m; i < numsamples; i += step)
            {
                UnityComplexNumberT<T> t;
                UnityComplexNumber::Mul(wd, data[i + j], t);
                UnityComplexNumber::Sub(data[i], t, data[i + j]);
                UnityComplexNumber::Add(data[i], t, data[i]);
            }
            UnityComplexNumber::Mul(wd, wr, wd);
        }
        w0 *= T(0.5);
    }
}